

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O0

void __thiscall
Assimp::SplitByBoneCountProcess::SplitMesh
          (SplitByBoneCountProcess *this,aiMesh *pMesh,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *poNewMeshes)

{
  allocator<bool> *paVar1;
  uint uVar2;
  aiBone *paVar3;
  undefined1 auVar4 [16];
  float fVar5;
  bool bVar6;
  uint uVar7;
  reference pvVar8;
  size_type sVar9;
  const_reference pvVar10;
  reference pvVar11;
  aiMesh *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar12;
  basic_formatter *this_01;
  aiVector3D *paVar13;
  aiColor4D *paVar14;
  ulong uVar15;
  size_type *psVar16;
  aiFace *paVar17;
  uint *puVar18;
  aiBone **ppaVar19;
  aiBone *this_02;
  aiVertexWeight *paVar20;
  aiFace *paVar21;
  aiVector3D *paVar22;
  aiColor4D *paVar23;
  ulong uVar24;
  reference rVar25;
  aiVertexWeight *local_6f8;
  aiFace *local_650;
  aiColor4t<float> *local_618;
  aiVector3t<float> *local_5e8;
  aiVector3t<float> *local_5b8;
  aiVector3t<float> *local_590;
  aiVector3t<float> *local_560;
  aiVector3t<float> *local_530;
  aiVertexWeight *dstWeight;
  uint newBoneIndex_1;
  uint b_4;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *bonesOnThisVertex_1;
  uint previousIndex;
  uint a_8;
  aiBone *bone_1;
  uint a_7;
  uint newBoneIndex;
  uint b_3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *bonesOnThisVertex;
  uint oldIndex;
  uint a_6;
  aiBone *dstBone;
  aiBone *srcBone;
  _Bit_type local_3d0;
  uint local_3c4;
  allocator<unsigned_int> local_3bd;
  uint a_5;
  undefined1 local_3b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> mappedBoneIndex;
  uint c_2;
  uint c_1;
  uint srcIndex;
  uint b_2;
  aiFace *dstFace;
  aiFace *srcFace;
  allocator<unsigned_int> local_375;
  uint a_4;
  undefined1 local_370 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousVertexIndices;
  uint local_350;
  uint nvi;
  uint a_3;
  uint a_2;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_1c8;
  aiMesh *local_1a8;
  aiMesh *newMesh;
  _Bit_type local_198;
  reference local_190;
  reference local_180;
  uint local_16c;
  iterator iStack_168;
  uint newIndex;
  uint *local_160;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_158;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_150;
  reference local_148;
  uint local_138;
  uint local_134;
  uint boneIndex;
  uint c;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *vb;
  aiFace *paStack_120;
  uint b_1;
  aiFace *face;
  _Bit_type local_110;
  value_type_conflict1 local_104;
  undefined1 local_100 [4];
  uint a_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newBonesAtCurrentFace;
  undefined1 local_e0 [4];
  uint numSubMeshVertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subMeshFaces;
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> isBoneUsed;
  uint numBones;
  vector<bool,_std::allocator<bool>_> isFaceHandled;
  uint numFacesHandled;
  uint local_5c;
  uint b;
  aiBone *bone;
  uint a;
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_39;
  undefined1 local_38 [8];
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  vertexBones;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *poNewMeshes_local;
  aiMesh *pMesh_local;
  SplitByBoneCountProcess *this_local;
  
  if (this->mMaxBoneCount < (ulong)pMesh->mNumBones) {
    uVar2 = pMesh->mNumVertices;
    vertexBones.
    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)poNewMeshes;
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::allocator(&local_39);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)local_38,(ulong)uVar2,&local_39);
    std::
    allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
    ::~allocator(&local_39);
    for (bone._0_4_ = 0; (uint)bone < pMesh->mNumBones; bone._0_4_ = (uint)bone + 1) {
      paVar3 = pMesh->mBones[(uint)bone];
      for (local_5c = 0; local_5c < paVar3->mNumWeights; local_5c = local_5c + 1) {
        pvVar8 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                               *)local_38,(ulong)paVar3->mWeights[local_5c].mVertexId);
        std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float_&,_true>
                  ((pair<unsigned_int,_float> *)
                   ((long)&isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage + 4),(uint *)&bone,
                   &paVar3->mWeights[local_5c].mWeight);
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        push_back(pvVar8,(value_type *)
                         ((long)&isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage + 4));
      }
    }
    isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    uVar2 = pMesh->mNumFaces;
    isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    paVar1 = (allocator<bool> *)
             ((long)&isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 6);
    std::allocator<bool>::allocator(paVar1);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&numBones,(ulong)uVar2,
               (bool *)((long)&isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + 7),paVar1);
    std::allocator<bool>::~allocator
              ((allocator<bool> *)
               ((long)&isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 6));
    while ((uint)isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage < pMesh->mNumFaces) {
      isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      uVar2 = pMesh->mNumBones;
      subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      paVar1 = (allocator<bool> *)
               ((long)&subMeshFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6);
      std::allocator<bool>::allocator(paVar1);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0,(ulong)uVar2,
                 (bool *)((long)&subMeshFaces.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7),paVar1);
      std::allocator<bool>::~allocator
                ((allocator<bool> *)
                 ((long)&subMeshFaces.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,
                 (ulong)pMesh->mNumFaces);
      newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      for (local_104 = 0; local_104 < pMesh->mNumFaces; local_104 = local_104 + 1) {
        rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&numBones,(ulong)local_104);
        local_110 = rVar25._M_mask;
        face = (aiFace *)rVar25._M_p;
        bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&face);
        if (!bVar6) {
          paStack_120 = pMesh->mFaces + local_104;
          for (vb._4_4_ = 0; vb._4_4_ < paStack_120->mNumIndices; vb._4_4_ = vb._4_4_ + 1) {
            _boneIndex = std::
                         vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                         ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                                       *)local_38,(ulong)paStack_120->mIndices[vb._4_4_]);
            local_134 = 0;
            while( true ) {
              uVar15 = (ulong)local_134;
              sVar9 = std::
                      vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ::size(_boneIndex);
              if (sVar9 <= uVar15) break;
              pvVar10 = std::
                        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ::operator[](_boneIndex,(ulong)local_134);
              local_138 = pvVar10->first;
              rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_c0,(ulong)local_138);
              local_148 = rVar25;
              bVar6 = std::_Bit_reference::operator_cast_to_bool(&local_148);
              if (!bVar6) {
                local_158._M_current =
                     (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        local_100);
                local_160 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)local_100);
                local_150 = std::
                            find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                                      (local_158,
                                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        )local_160,&local_138);
                iStack_168 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        local_100);
                bVar6 = __gnu_cxx::operator==(&local_150,&stack0xfffffffffffffe98);
                if (bVar6) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                             &local_138);
                }
              }
              local_134 = local_134 + 1;
            }
          }
          uVar15 = (ulong)(uint)isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage;
          sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
          if (uVar15 + sVar9 <= this->mMaxBoneCount) {
            while( true ) {
              bVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
              if (((bVar6 ^ 0xffU) & 1) == 0) break;
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100)
              ;
              local_16c = *pvVar11;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
              rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_c0,(ulong)local_16c);
              local_180 = rVar25;
              bVar6 = std::_Bit_reference::operator_cast_to_bool(&local_180);
              if (!bVar6) {
                rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)local_c0,(ulong)local_16c
                                   );
                local_190 = rVar25;
                std::_Bit_reference::operator=(&local_190,true);
                isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage._0_4_ =
                     (uint)isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage + 1;
              }
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,&local_104);
            newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 newBonesAtCurrentFace.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + paStack_120->mNumIndices;
            rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&numBones,(ulong)local_104);
            local_198 = rVar25._M_mask;
            newMesh = (aiMesh *)rVar25._M_p;
            std::_Bit_reference::operator=((_Bit_reference *)&newMesh,true);
            isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage._0_4_ =
                 (uint)isFaceHandled.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage + 1;
          }
        }
      }
      this_00 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_00);
      local_1a8 = this_00;
      if ((pMesh->mName).length != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_340);
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_340,&(pMesh->mName).data);
        pbVar12 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<(pbVar12,(char (*) [5])"_sub");
        _a_3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          vertexBones.
                          super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_01 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator<<(pbVar12,(unsigned_long *)&a_3);
        Formatter::basic_formatter::operator_cast_to_string(&local_1c8,this_01);
        aiString::Set(&this_00->mName,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_340);
      }
      local_1a8->mMaterialIndex = pMesh->mMaterialIndex;
      local_1a8->mPrimitiveTypes = pMesh->mPrimitiveTypes;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                 vertexBones.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8);
      local_1a8->mNumVertices =
           newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
      local_1a8->mNumFaces = (uint)sVar9;
      uVar15 = (ulong)local_1a8->mNumVertices;
      paVar13 = (aiVector3D *)operator_new__(uVar15 * 0xc);
      if (uVar15 != 0) {
        local_530 = paVar13;
        do {
          aiVector3t<float>::aiVector3t(local_530);
          local_530 = local_530 + 1;
        } while (local_530 != paVar13 + uVar15);
      }
      local_1a8->mVertices = paVar13;
      bVar6 = aiMesh::HasNormals(pMesh);
      if (bVar6) {
        uVar15 = (ulong)local_1a8->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__(uVar15 * 0xc);
        if (uVar15 != 0) {
          local_560 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_560);
            local_560 = local_560 + 1;
          } while (local_560 != paVar13 + uVar15);
        }
        local_1a8->mNormals = paVar13;
      }
      bVar6 = aiMesh::HasTangentsAndBitangents(pMesh);
      if (bVar6) {
        uVar15 = (ulong)local_1a8->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__(uVar15 * 0xc);
        if (uVar15 != 0) {
          local_590 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_590);
            local_590 = local_590 + 1;
          } while (local_590 != paVar13 + uVar15);
        }
        local_1a8->mTangents = paVar13;
        uVar15 = (ulong)local_1a8->mNumVertices;
        paVar13 = (aiVector3D *)operator_new__(uVar15 * 0xc);
        if (uVar15 != 0) {
          local_5b8 = paVar13;
          do {
            aiVector3t<float>::aiVector3t(local_5b8);
            local_5b8 = local_5b8 + 1;
          } while (local_5b8 != paVar13 + uVar15);
        }
        local_1a8->mBitangents = paVar13;
      }
      for (nvi = 0; nvi < 8; nvi = nvi + 1) {
        bVar6 = aiMesh::HasTextureCoords(pMesh,nvi);
        if (bVar6) {
          uVar15 = (ulong)local_1a8->mNumVertices;
          paVar13 = (aiVector3D *)operator_new__(uVar15 * 0xc);
          if (uVar15 != 0) {
            local_5e8 = paVar13;
            do {
              aiVector3t<float>::aiVector3t(local_5e8);
              local_5e8 = local_5e8 + 1;
            } while (local_5e8 != paVar13 + uVar15);
          }
          local_1a8->mTextureCoords[nvi] = paVar13;
        }
        local_1a8->mNumUVComponents[nvi] = pMesh->mNumUVComponents[nvi];
      }
      for (local_350 = 0; local_350 < 8; local_350 = local_350 + 1) {
        bVar6 = aiMesh::HasVertexColors(pMesh,local_350);
        if (bVar6) {
          uVar15 = (ulong)local_1a8->mNumVertices;
          paVar14 = (aiColor4D *)operator_new__(uVar15 << 4);
          if (uVar15 != 0) {
            local_618 = paVar14;
            do {
              aiColor4t<float>::aiColor4t(local_618);
              local_618 = local_618 + 1;
            } while (local_618 != paVar14 + uVar15);
          }
          local_1a8->mColors[local_350] = paVar14;
        }
      }
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar9;
      uVar15 = SUB168(auVar4 * ZEXT816(0x10),0);
      uVar24 = uVar15 + 8;
      if (0xfffffffffffffff7 < uVar15) {
        uVar24 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
        uVar24 = 0xffffffffffffffff;
      }
      psVar16 = (size_type *)operator_new__(uVar24);
      *psVar16 = sVar9;
      paVar21 = (aiFace *)(psVar16 + 1);
      if (sVar9 != 0) {
        local_650 = paVar21;
        do {
          aiFace::aiFace(local_650);
          local_650 = local_650 + 1;
        } while (local_650 != paVar21 + sVar9);
      }
      local_1a8->mFaces = paVar21;
      previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar15 = (ulong)newBonesAtCurrentFace.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
      a_4 = std::numeric_limits<unsigned_int>::max();
      std::allocator<unsigned_int>::allocator(&local_375);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,uVar15,&a_4,
                 &local_375);
      std::allocator<unsigned_int>::~allocator(&local_375);
      srcFace._4_4_ = 0;
      while( true ) {
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
        if (sVar9 <= srcFace._4_4_) break;
        paVar21 = pMesh->mFaces;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0,
                             (ulong)srcFace._4_4_);
        uVar2 = *pvVar11;
        paVar17 = local_1a8->mFaces + srcFace._4_4_;
        paVar17->mNumIndices = paVar21[uVar2].mNumIndices;
        puVar18 = (uint *)operator_new__((ulong)paVar17->mNumIndices << 2);
        paVar17->mIndices = puVar18;
        for (c_1 = 0; c_1 < paVar17->mNumIndices; c_1 = c_1 + 1) {
          uVar7 = paVar21[uVar2].mIndices[c_1];
          paVar17->mIndices[c_1] =
               previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,
                               (ulong)previousVertexIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          *pvVar11 = uVar7;
          paVar13 = pMesh->mVertices;
          paVar22 = local_1a8->mVertices;
          paVar22[previousVertexIndices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_].z = paVar13[uVar7].z;
          paVar13 = paVar13 + uVar7;
          fVar5 = paVar13->y;
          paVar22 = paVar22 + previousVertexIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          paVar22->x = paVar13->x;
          paVar22->y = fVar5;
          bVar6 = aiMesh::HasNormals(pMesh);
          if (bVar6) {
            paVar22 = pMesh->mNormals + uVar7;
            paVar13 = local_1a8->mNormals +
                      previousVertexIndices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            fVar5 = paVar22->y;
            paVar13->x = paVar22->x;
            paVar13->y = fVar5;
            paVar13->z = paVar22->z;
          }
          bVar6 = aiMesh::HasTangentsAndBitangents(pMesh);
          if (bVar6) {
            paVar22 = pMesh->mTangents + uVar7;
            paVar13 = local_1a8->mTangents +
                      previousVertexIndices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            fVar5 = paVar22->y;
            paVar13->x = paVar22->x;
            paVar13->y = fVar5;
            paVar13->z = paVar22->z;
            paVar22 = pMesh->mBitangents + uVar7;
            paVar13 = local_1a8->mBitangents +
                      previousVertexIndices.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            fVar5 = paVar22->y;
            paVar13->x = paVar22->x;
            paVar13->y = fVar5;
            paVar13->z = paVar22->z;
          }
          for (mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 8;
              mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
            bVar6 = aiMesh::HasTextureCoords
                              (pMesh,mappedBoneIndex.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            if (bVar6) {
              paVar22 = pMesh->mTextureCoords
                        [mappedBoneIndex.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_] + uVar7;
              paVar13 = local_1a8->mTextureCoords
                        [mappedBoneIndex.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_] +
                        previousVertexIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
              fVar5 = paVar22->y;
              paVar13->x = paVar22->x;
              paVar13->y = fVar5;
              paVar13->z = paVar22->z;
            }
          }
          for (mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              (uint)mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage < 8;
              mappedBoneIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (uint)mappedBoneIndex.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1) {
            bVar6 = aiMesh::HasVertexColors
                              (pMesh,(uint)mappedBoneIndex.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar6) {
              paVar23 = pMesh->mColors
                        [(uint)mappedBoneIndex.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage] + uVar7;
              paVar14 = local_1a8->mColors
                        [(uint)mappedBoneIndex.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage] +
                        previousVertexIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
              fVar5 = paVar23->g;
              paVar14->r = paVar23->r;
              paVar14->g = fVar5;
              fVar5 = paVar23->a;
              paVar14->b = paVar23->b;
              paVar14->a = fVar5;
            }
          }
          previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        }
        srcFace._4_4_ = srcFace._4_4_ + 1;
      }
      if (previousVertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ !=
          newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        __assert_fail("nvi == numSubMeshVertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                      ,0x135,
                      "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                     );
      }
      local_1a8->mNumBones = 0;
      ppaVar19 = (aiBone **)
                 operator_new__((ulong)(uint)isBoneUsed.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_end_of_storage << 3
                               );
      local_1a8->mBones = ppaVar19;
      uVar2 = pMesh->mNumBones;
      a_5 = std::numeric_limits<unsigned_int>::max();
      std::allocator<unsigned_int>::allocator(&local_3bd);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,(ulong)uVar2,&a_5,
                 &local_3bd);
      std::allocator<unsigned_int>::~allocator(&local_3bd);
      for (local_3c4 = 0; local_3c4 < pMesh->mNumBones; local_3c4 = local_3c4 + 1) {
        rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_c0,(ulong)local_3c4);
        local_3d0 = rVar25._M_mask;
        srcBone = (aiBone *)rVar25._M_p;
        bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&srcBone);
        if (((bVar6 ^ 0xffU) & 1) == 0) {
          paVar3 = pMesh->mBones[local_3c4];
          this_02 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_02);
          uVar2 = local_1a8->mNumBones;
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                               (ulong)local_3c4);
          *pvVar11 = uVar2;
          uVar2 = local_1a8->mNumBones;
          local_1a8->mNumBones = uVar2 + 1;
          local_1a8->mBones[uVar2] = this_02;
          aiString::operator=((aiString *)this_02,&paVar3->mName);
          memcpy(&this_02->mOffsetMatrix,&paVar3->mOffsetMatrix,0x40);
          this_02->mNumWeights = 0;
        }
      }
      if (local_1a8->mNumBones !=
          (uint)isBoneUsed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage) {
        __assert_fail("newMesh->mNumBones == numBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                      ,0x14b,
                      "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                     );
      }
      for (bonesOnThisVertex._4_4_ = 0;
          bonesOnThisVertex._4_4_ <
          newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bonesOnThisVertex._4_4_ = bonesOnThisVertex._4_4_ + 1) {
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,
                             (ulong)bonesOnThisVertex._4_4_);
        pvVar8 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                               *)local_38,(ulong)*pvVar11);
        a_7 = 0;
        while( true ) {
          sVar9 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::size(pvVar8);
          if (sVar9 <= a_7) break;
          pvVar10 = std::
                    vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ::operator[](pvVar8,(ulong)a_7);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                               (ulong)pvVar10->first);
          uVar2 = *pvVar11;
          uVar7 = std::numeric_limits<unsigned_int>::max();
          if (uVar2 != uVar7) {
            local_1a8->mBones[uVar2]->mNumWeights = local_1a8->mBones[uVar2]->mNumWeights + 1;
          }
          a_7 = a_7 + 1;
        }
      }
      for (bone_1._4_4_ = 0; bone_1._4_4_ < local_1a8->mNumBones; bone_1._4_4_ = bone_1._4_4_ + 1) {
        paVar3 = local_1a8->mBones[bone_1._4_4_];
        if (paVar3->mNumWeights == 0) {
          __assert_fail("bone->mNumWeights > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x15f,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        uVar15 = (ulong)paVar3->mNumWeights;
        paVar20 = (aiVertexWeight *)operator_new__(uVar15 << 3);
        if (uVar15 != 0) {
          local_6f8 = paVar20;
          do {
            aiVertexWeight::aiVertexWeight(local_6f8);
            local_6f8 = local_6f8 + 1;
          } while (local_6f8 != paVar20 + uVar15);
        }
        paVar3->mWeights = paVar20;
        paVar3->mNumWeights = 0;
      }
      for (bonesOnThisVertex_1._4_4_ = 0;
          bonesOnThisVertex_1._4_4_ <
          newBonesAtCurrentFace.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          bonesOnThisVertex_1._4_4_ = bonesOnThisVertex_1._4_4_ + 1) {
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370,
                             (ulong)bonesOnThisVertex_1._4_4_);
        pvVar8 = std::
                 vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                               *)local_38,(ulong)*pvVar11);
        dstWeight._4_4_ = 0;
        while( true ) {
          sVar9 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::size(pvVar8);
          if (sVar9 <= dstWeight._4_4_) break;
          pvVar10 = std::
                    vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ::operator[](pvVar8,(ulong)dstWeight._4_4_);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
                               (ulong)pvVar10->first);
          uVar2 = *pvVar11;
          uVar7 = std::numeric_limits<unsigned_int>::max();
          if (uVar2 == uVar7) {
            __assert_fail("newBoneIndex != std::numeric_limits<unsigned int>::max()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/SplitByBoneCountProcess.cpp"
                          ,0x170,
                          "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                         );
          }
          paVar20 = local_1a8->mBones[uVar2]->mWeights + local_1a8->mBones[uVar2]->mNumWeights;
          local_1a8->mBones[uVar2]->mNumWeights = local_1a8->mBones[uVar2]->mNumWeights + 1;
          paVar20->mVertexId = bonesOnThisVertex_1._4_4_;
          pvVar10 = std::
                    vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ::operator[](pvVar8,(ulong)dstWeight._4_4_);
          paVar20->mWeight = pvVar10->second;
          dstWeight._4_4_ = dstWeight._4_4_ + 1;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_370);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)&numBones);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *)local_38);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::SplitMesh( const aiMesh* pMesh, std::vector<aiMesh*>& poNewMeshes) const
{
    // skip if not necessary
    if( pMesh->mNumBones <= mMaxBoneCount )
        return;

    // necessary optimisation: build a list of all affecting bones for each vertex
    // TODO: (thom) maybe add a custom allocator here to avoid allocating tens of thousands of small arrays
    typedef std::pair<unsigned int, float> BoneWeight;
    std::vector< std::vector<BoneWeight> > vertexBones( pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumBones; ++a)
    {
        const aiBone* bone = pMesh->mBones[a];
        for( unsigned int b = 0; b < bone->mNumWeights; ++b)
            vertexBones[ bone->mWeights[b].mVertexId ].push_back( BoneWeight( a, bone->mWeights[b].mWeight));
    }

    unsigned int numFacesHandled = 0;
    std::vector<bool> isFaceHandled( pMesh->mNumFaces, false);
    while( numFacesHandled < pMesh->mNumFaces )
    {
        // which bones are used in the current submesh
        unsigned int numBones = 0;
        std::vector<bool> isBoneUsed( pMesh->mNumBones, false);
        // indices of the faces which are going to go into this submesh
        std::vector<unsigned int> subMeshFaces;
        subMeshFaces.reserve( pMesh->mNumFaces);
        // accumulated vertex count of all the faces in this submesh
        unsigned int numSubMeshVertices = 0;
        // a small local array of new bones for the current face. State of all used bones for that face
        // can only be updated AFTER the face is completely analysed. Thanks to imre for the fix.
        std::vector<unsigned int> newBonesAtCurrentFace;

        // add faces to the new submesh as long as all bones affecting the faces' vertices fit in the limit
        for( unsigned int a = 0; a < pMesh->mNumFaces; ++a)
        {
            // skip if the face is already stored in a submesh
            if( isFaceHandled[a] )
                continue;

            const aiFace& face = pMesh->mFaces[a];
            // check every vertex if its bones would still fit into the current submesh
            for( unsigned int b = 0; b < face.mNumIndices; ++b )
            {
                const std::vector<BoneWeight>& vb = vertexBones[face.mIndices[b]];
                for( unsigned int c = 0; c < vb.size(); ++c)
                {
                    unsigned int boneIndex = vb[c].first;
                    // if the bone is already used in this submesh, it's ok
                    if( isBoneUsed[boneIndex] )
                        continue;

                    // if it's not used, yet, we would need to add it. Store its bone index
                    if( std::find( newBonesAtCurrentFace.begin(), newBonesAtCurrentFace.end(), boneIndex) == newBonesAtCurrentFace.end() )
                        newBonesAtCurrentFace.push_back( boneIndex);
                }
            }

            // leave out the face if the new bones required for this face don't fit the bone count limit anymore
            if( numBones + newBonesAtCurrentFace.size() > mMaxBoneCount )
                continue;

            // mark all new bones as necessary
            while( !newBonesAtCurrentFace.empty() )
            {
                unsigned int newIndex = newBonesAtCurrentFace.back();
                newBonesAtCurrentFace.pop_back(); // this also avoids the deallocation which comes with a clear()
                if( isBoneUsed[newIndex] )
                    continue;

                isBoneUsed[newIndex] = true;
                numBones++;
            }

            // store the face index and the vertex count
            subMeshFaces.push_back( a);
            numSubMeshVertices += face.mNumIndices;

            // remember that this face is handled
            isFaceHandled[a] = true;
            numFacesHandled++;
        }

        // create a new mesh to hold this subset of the source mesh
        aiMesh* newMesh = new aiMesh;
        if( pMesh->mName.length > 0 )
            newMesh->mName.Set( format() << pMesh->mName.data << "_sub" << poNewMeshes.size());
        newMesh->mMaterialIndex = pMesh->mMaterialIndex;
        newMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        poNewMeshes.push_back( newMesh);

        // create all the arrays for this mesh if the old mesh contained them
        newMesh->mNumVertices = numSubMeshVertices;
        newMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
        newMesh->mVertices = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasNormals() )
            newMesh->mNormals = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasTangentsAndBitangents() )
        {
            newMesh->mTangents = new aiVector3D[newMesh->mNumVertices];
            newMesh->mBitangents = new aiVector3D[newMesh->mNumVertices];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( pMesh->HasTextureCoords( a) )
                newMesh->mTextureCoords[a] = new aiVector3D[newMesh->mNumVertices];
            newMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( pMesh->HasVertexColors( a) )
                newMesh->mColors[a] = new aiColor4D[newMesh->mNumVertices];
        }

        // and copy over the data, generating faces with linear indices along the way
        newMesh->mFaces = new aiFace[subMeshFaces.size()];
        unsigned int nvi = 0; // next vertex index
        std::vector<unsigned int> previousVertexIndices( numSubMeshVertices, std::numeric_limits<unsigned int>::max()); // per new vertex: its index in the source mesh
        for( unsigned int a = 0; a < subMeshFaces.size(); ++a )
        {
            const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
            aiFace& dstFace = newMesh->mFaces[a];
            dstFace.mNumIndices = srcFace.mNumIndices;
            dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

            // accumulate linearly all the vertices of the source face
            for( unsigned int b = 0; b < dstFace.mNumIndices; ++b )
            {
                unsigned int srcIndex = srcFace.mIndices[b];
                dstFace.mIndices[b] = nvi;
                previousVertexIndices[nvi] = srcIndex;

                newMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
                if( pMesh->HasNormals() )
                    newMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
                if( pMesh->HasTangentsAndBitangents() )
                {
                    newMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
                    newMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++c )
                {
                    if( pMesh->HasTextureCoords( c) )
                        newMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c )
                {
                    if( pMesh->HasVertexColors( c) )
                        newMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
                }

                nvi++;
            }
        }

        ai_assert( nvi == numSubMeshVertices );

        // Create the bones for the new submesh: first create the bone array
        newMesh->mNumBones = 0;
        newMesh->mBones = new aiBone*[numBones];

        std::vector<unsigned int> mappedBoneIndex( pMesh->mNumBones, std::numeric_limits<unsigned int>::max());
        for( unsigned int a = 0; a < pMesh->mNumBones; ++a )
        {
            if( !isBoneUsed[a] )
                continue;

            // create the new bone
            const aiBone* srcBone = pMesh->mBones[a];
            aiBone* dstBone = new aiBone;
            mappedBoneIndex[a] = newMesh->mNumBones;
            newMesh->mBones[newMesh->mNumBones++] = dstBone;
            dstBone->mName = srcBone->mName;
            dstBone->mOffsetMatrix = srcBone->mOffsetMatrix;
            dstBone->mNumWeights = 0;
        }

        ai_assert( newMesh->mNumBones == numBones );

        // iterate over all new vertices and count which bones affected its old vertex in the source mesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a )
        {
            unsigned int oldIndex = previousVertexIndices[a];
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[oldIndex];

            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b )
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                if( newBoneIndex != std::numeric_limits<unsigned int>::max() )
                    newMesh->mBones[newBoneIndex]->mNumWeights++;
            }
        }

        // allocate all bone weight arrays accordingly
        for( unsigned int a = 0; a < newMesh->mNumBones; ++a )
        {
            aiBone* bone = newMesh->mBones[a];
            ai_assert( bone->mNumWeights > 0 );
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            bone->mNumWeights = 0; // for counting up in the next step
        }

        // now copy all the bone vertex weights for all the vertices which made it into the new submesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a)
        {
            // find the source vertex for it in the source mesh
            unsigned int previousIndex = previousVertexIndices[a];
            // these bones were affecting it
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[previousIndex];
            // all of the bones affecting it should be present in the new submesh, or else
            // the face it comprises shouldn't be present
            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b)
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                ai_assert( newBoneIndex != std::numeric_limits<unsigned int>::max() );
                aiVertexWeight* dstWeight = newMesh->mBones[newBoneIndex]->mWeights + newMesh->mBones[newBoneIndex]->mNumWeights;
                newMesh->mBones[newBoneIndex]->mNumWeights++;

                dstWeight->mVertexId = a;
                dstWeight->mWeight = bonesOnThisVertex[b].second;
            }
        }

        // I have the strange feeling that this will break apart at some point in time...
    }
}